

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::BufferSubDataUploadCase::init
          (BufferSubDataUploadCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  EVP_PKEY_CTX *ctx_00;
  char *local_1b0;
  char *local_1a8 [3];
  MessageBuilder local_190;
  BufferSubDataUploadCase *local_10;
  BufferSubDataUploadCase *this_local;
  
  local_10 = this;
  this_00 = tcu::TestContext::getLog
                      ((this->
                       super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                       ).
                       super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                       .super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_190,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_190,
                      (char (*) [54])"Testing glBufferSubData() function call performance. ");
  local_1a8[0] = "Half of the buffer data is updated with glBufferSubData. ";
  if ((this->m_fullUpload & 1U) != 0) {
    local_1a8[0] = "The whole buffer is updated with glBufferSubData. ";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1a8);
  local_1b0 = "";
  if ((this->m_invalidateBeforeUse & 1U) != 0) {
    local_1b0 = "The buffer is cleared with glBufferData(..., NULL) before glBufferSubData upload.";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1b0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2b9e07b);
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_190);
  iVar1 = BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          ::init(&this->
                  super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ,ctx_00);
  return iVar1;
}

Assistant:

void BufferSubDataUploadCase::init (void)
{
	// Describe what the test tries to do
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing glBufferSubData() function call performance. "
		<< ((m_fullUpload) ? ("The whole buffer is updated with glBufferSubData. ") : ("Half of the buffer data is updated with glBufferSubData. "))
		<< ((m_invalidateBeforeUse) ? ("The buffer is cleared with glBufferData(..., NULL) before glBufferSubData upload.") : ("")) << "\n"
		<< tcu::TestLog::EndMessage;

	BasicUploadCase<SingleOperationDuration>::init();
}